

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O2

int main(void)

{
  rtr_socket **pprVar1;
  tommy_hashlin_node **pptVar2;
  undefined8 uVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  rtr_socket *socket;
  rtr_socket *__ptr;
  spki_record *psVar7;
  spki_record *psVar8;
  spki_record *record;
  spki_record *record_00;
  rtr_socket *socket_00;
  int i_1;
  spki_table *psVar9;
  ulong uVar10;
  long lVar11;
  char *__assertion;
  uint j_2;
  int j;
  long lVar12;
  int i;
  uint uVar13;
  long in_FS_OFFSET;
  uint result_len;
  spki_table table;
  uint8_t ski [20];
  uint8_t *local_1b0;
  spki_record *result;
  undefined8 local_38;
  
  local_38 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  socket = (rtr_socket *)malloc(0x80);
  __ptr = (rtr_socket *)malloc(0x80);
  psVar7 = create_record(1,0,0,(rtr_socket *)0x0);
  spki_table_init(&table,(spki_update_fp)0x0);
  ski._16_4_ = *(undefined4 *)(psVar7->ski + 0x10);
  ski._0_8_ = *(undefined8 *)psVar7->ski;
  ski._8_8_ = *(undefined8 *)(psVar7->ski + 8);
  free(psVar7);
  for (uVar13 = 0; uVar13 != 0xff; uVar13 = uVar13 + 1) {
    socket_00 = socket;
    if ((uVar13 & 1) == 0) {
      socket_00 = __ptr;
    }
    psVar7 = create_record(1,0,uVar13,socket_00);
    _spki_table_add_assert(&table,psVar7);
    free(psVar7);
  }
  spki_table_get_all(&table,1,ski,&result,&result_len);
  psVar7 = result;
  uVar13 = result_len;
  uVar10 = (ulong)result_len;
  lVar11 = 0;
  while (uVar10 * 0x80 + 0x80 != lVar11 + 0x80) {
    if (psVar7->asn != 1) {
      __assert_fail("result->asn == asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x93,"void test_ht_1(void)");
    }
    iVar6 = bcmp(psVar7->ski + lVar11,ski,0x14);
    lVar11 = lVar11 + 0x80;
    if (iVar6 != 0) {
      __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x94,"void test_ht_1(void)");
    }
  }
  if (uVar13 != 0xff) {
    __assert_fail("count == 255",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x97,"void test_ht_1(void)");
  }
  free(psVar7);
  spki_table_src_remove(&table,socket);
  spki_table_get_all(&table,1,ski,&result,&result_len);
  lVar11 = (ulong)result_len + 1;
  psVar7 = result;
  while (lVar11 = lVar11 + -1, lVar11 != 0) {
    if (psVar7->asn != 1) {
      __assert_fail("result[i].asn == asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x9f,"void test_ht_1(void)");
    }
    iVar6 = bcmp(psVar7,ski,0x14);
    if (iVar6 != 0) {
      __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0xa0,"void test_ht_1(void)");
    }
    pprVar1 = &psVar7->socket;
    psVar7 = psVar7 + 1;
    if (*pprVar1 != __ptr) {
      __assert_fail("result[i].socket == socket_two",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0xa1,"void test_ht_1(void)");
    }
  }
  spki_table_free(&table);
  free(result);
  free(socket);
  free(__ptr);
  printf("%s() complete\n","test_ht_1");
  psVar7 = create_record(10,0x14,0x1e,(rtr_socket *)0x0);
  psVar8 = create_record(10,0x14,0x28,(rtr_socket *)0x0);
  spki_table_init(&table,(spki_update_fp)0x0);
  _spki_table_add_assert(&table,psVar7);
  _spki_table_add_assert(&table,psVar8);
  spki_table_get_all(&table,10,psVar7->ski,(spki_record **)ski,(uint *)&result);
  uVar3 = ski._0_8_;
  if ((int)result != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xbe,"void test_ht_2(void)");
  }
  _Var4 = spki_records_are_equal((spki_record *)ski._0_8_,psVar7);
  _Var5 = spki_records_are_equal((spki_record *)uVar3,psVar8);
  if (_Var4 == _Var5) {
    __assert_fail("spki_records_are_equal(&result[0], record1) != spki_records_are_equal(&result[0], record2)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc1,"void test_ht_2(void)");
  }
  _Var4 = spki_records_are_equal((spki_record *)(uVar3 + 0x80),psVar7);
  _Var5 = spki_records_are_equal((spki_record *)(uVar3 + 0x80),psVar8);
  if (_Var4 == _Var5) {
    __assert_fail("spki_records_are_equal(&result[1], record1) != spki_records_are_equal(&result[1], record2)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc2,"void test_ht_2(void)");
  }
  free((void *)uVar3);
  _spki_table_remove_assert(&table,psVar7);
  spki_table_get_all(&table,10,psVar7->ski,(spki_record **)ski,(uint *)&result);
  uVar3 = ski._0_8_;
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,200,"void test_ht_2(void)");
  }
  _Var4 = spki_records_are_equal((spki_record *)ski._0_8_,psVar8);
  if (!_Var4) {
    __assert_fail("spki_records_are_equal(&result[0], record2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xc9,"void test_ht_2(void)");
  }
  free((void *)uVar3);
  _spki_table_remove_assert(&table,psVar8);
  spki_table_get_all(&table,10,psVar7->ski,(spki_record **)ski,(uint *)&result);
  if ((int)result != 0) {
    __assert_fail("result_len == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xcf,"void test_ht_2(void)");
  }
  if (ski._0_8_ != 0) {
    __assert_fail("!result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xd0,"void test_ht_2(void)");
  }
  spki_table_get_all(&table,10,psVar8->ski,(spki_record **)ski,(uint *)&result);
  if ((int)result != 0) {
    __assert_fail("result_len == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xd2,"void test_ht_2(void)");
  }
  if (ski._0_8_ != 0) {
    __assert_fail("!result",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xd3,"void test_ht_2(void)");
  }
  free(psVar7);
  free(psVar8);
  spki_table_free(&table);
  printf("%s() complete\n","test_ht_2");
  psVar7 = create_record(10,10,10,(rtr_socket *)0x0);
  psVar8 = create_record(10,10,0xb,(rtr_socket *)0x0);
  record = create_record(10,0xb,10,(rtr_socket *)0x0);
  record_00 = create_record(0xb,10,10,(rtr_socket *)0x0);
  spki_table_init(&table,(spki_update_fp)0x0);
  _spki_table_add_assert(&table,psVar7);
  _spki_table_add_assert(&table,psVar8);
  _spki_table_add_assert(&table,record);
  _spki_table_add_assert(&table,record_00);
  _spki_table_remove_assert(&table,psVar7);
  iVar6 = spki_table_get_all(&table,psVar8->asn,psVar8->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xf8,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xf9,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record->asn,record->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xfc,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xfd,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record_00->asn,record_00->ski,(spki_record **)ski,
                             (uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x100,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x101,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  _spki_table_add_assert(&table,psVar7);
  _spki_table_remove_assert(&table,psVar8);
  iVar6 = spki_table_get_all(&table,psVar7->asn,psVar7->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x109,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10a,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record->asn,record->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10d,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10e,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record_00->asn,record_00->ski,(spki_record **)ski,
                             (uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x111,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x112,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  _spki_table_add_assert(&table,psVar8);
  _spki_table_remove_assert(&table,record);
  iVar6 = spki_table_get_all(&table,psVar7->asn,psVar7->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11a,"void test_ht_3(void)");
  }
  if ((int)result != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11b,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,psVar8->asn,psVar8->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11e,"void test_ht_3(void)");
  }
  if ((int)result != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11f,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record_00->asn,record_00->ski,(spki_record **)ski,
                             (uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x122,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x123,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  _spki_table_add_assert(&table,record);
  _spki_table_remove_assert(&table,record_00);
  iVar6 = spki_table_get_all(&table,psVar7->asn,psVar7->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,299,"void test_ht_3(void)");
  }
  if ((int)result != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,300,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,psVar8->asn,psVar8->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x12f,"void test_ht_3(void)");
  }
  if ((int)result != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x130,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  iVar6 = spki_table_get_all(&table,record->asn,record->ski,(spki_record **)ski,(uint *)&result);
  if (iVar6 != 0) {
    __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x133,"void test_ht_3(void)");
  }
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x134,"void test_ht_3(void)");
  }
  free((void *)ski._0_8_);
  psVar9 = &table;
  spki_table_free(psVar9);
  free(psVar7);
  free(psVar8);
  free(record);
  free(record_00);
  printf("%s complete\n");
  spki_table_init((spki_table *)ski,(spki_update_fp)0x0);
  for (lVar11 = 0; lVar11 != 0x32; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 != 0x32; lVar12 = lVar12 + 1) {
      psVar7 = create_record((int)lVar11,(int)lVar12,(int)lVar12,(rtr_socket *)0x0);
      (psVar9->hashtable).bucket[lVar12] = (tommy_hashlin_node **)psVar7;
      _spki_table_add_assert((spki_table *)ski,psVar7);
    }
    psVar9 = (spki_table *)(psVar9[1].hashtable.bucket + 4);
  }
  psVar9 = &table;
  for (lVar11 = 0; lVar11 != 0x32; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 != 0x32; lVar12 = lVar12 + 1) {
      psVar7 = (spki_record *)(psVar9->hashtable).bucket[lVar12];
      iVar6 = spki_table_get_all((spki_table *)ski,psVar7->asn,(uint8_t *)psVar7,&result,&result_len
                                );
      if (iVar6 != 0) {
        __assert_fail("spki_table_get_all(&table, records[i][j]->asn, records[i][j]->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x159,"void test_ht_4(void)");
      }
      if (result_len != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x15a,"void test_ht_4(void)");
      }
      _spki_table_remove_assert((spki_table *)ski,psVar7);
      free(result);
      free(psVar7);
    }
    psVar9 = (spki_table *)(psVar9[1].hashtable.bucket + 4);
  }
  psVar9 = &table;
  for (lVar11 = 0; lVar11 != 0x32; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 != 0x32; lVar12 = lVar12 + 1) {
      psVar7 = create_record((int)lVar11,(int)lVar12,(int)lVar12,(rtr_socket *)0x0);
      (psVar9->hashtable).bucket[lVar12] = (tommy_hashlin_node **)psVar7;
      _spki_table_add_assert((spki_table *)ski,psVar7);
      free(psVar7);
    }
    psVar9 = (spki_table *)(psVar9[1].hashtable.bucket + 4);
  }
  spki_table_free((spki_table *)ski);
  printf("%s() complete\n","test_ht_4");
  psVar7 = create_record(10,10,10,(rtr_socket *)0x0);
  psVar8 = create_record(10,10,10,(rtr_socket *)0x0);
  spki_table_init(&table,(spki_update_fp)0x0);
  iVar6 = spki_table_add_entry(&table,psVar7);
  if (iVar6 != 0) {
    __assert_fail("spki_table_add_entry(&table, record1) == SPKI_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17c,"void test_ht_5(void)");
  }
  iVar6 = spki_table_add_entry(&table,psVar8);
  if (iVar6 != -2) {
    __assert_fail("spki_table_add_entry(&table, record2) == SPKI_DUPLICATE_RECORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17d,"void test_ht_5(void)");
  }
  iVar6 = spki_table_add_entry(&table,psVar7);
  if (iVar6 != -2) {
    __assert_fail("spki_table_add_entry(&table, record1) == SPKI_DUPLICATE_RECORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x17e,"void test_ht_5(void)");
  }
  spki_table_get_all(&table,10,psVar7->ski,(spki_record **)ski,(uint *)&result);
  if ((int)result != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x185,"void test_ht_5(void)");
  }
  free((void *)ski._0_8_);
  psVar9 = &table;
  spki_table_free(psVar9);
  free(psVar7);
  free(psVar8);
  printf("%s() complete\n");
  spki_table_init((spki_table *)ski,(spki_update_fp)0x0);
  for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
    for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
      psVar7 = create_record((int)lVar12,(int)lVar11,(int)lVar12,(rtr_socket *)0x0);
      (psVar9->hashtable).bucket[lVar12] = (tommy_hashlin_node **)psVar7;
      _spki_table_add_assert((spki_table *)ski,psVar7);
    }
    psVar9 = (spki_table *)((psVar9->hashtable).bucket + 10);
  }
  psVar9 = &table;
  lVar11 = 0;
  do {
    if (lVar11 == 10) {
      spki_table_free((spki_table *)ski);
      printf("%s() complete\n");
      spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
      for (lVar11 = 0; lVar11 != 2000; lVar11 = lVar11 + 1) {
        psVar7 = create_record(0x9fb,(int)lVar11,(int)lVar11,(rtr_socket *)0x0);
        *(spki_record **)(ski + lVar11 * 8) = psVar7;
        _spki_table_add_assert((spki_table *)&result,psVar7);
      }
      lVar11 = 0;
      while( true ) {
        if (lVar11 == 2000) {
          spki_table_free((spki_table *)&result);
          spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
          for (lVar11 = 0; lVar11 != 2000; lVar11 = lVar11 + 1) {
            psVar7 = create_record((int)lVar11,100,100,(rtr_socket *)0x0);
            *(spki_record **)(ski + lVar11 * 8) = psVar7;
            _spki_table_add_assert((spki_table *)&result,psVar7);
          }
          lVar11 = 0;
          psVar9 = &table;
          while( true ) {
            if (lVar11 == 2000) {
              spki_table_free((spki_table *)&result);
              spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
              for (lVar11 = 0; lVar11 != 2000; lVar11 = lVar11 + 1) {
                for (lVar12 = 0; lVar12 != 200; lVar12 = lVar12 + 1) {
                  psVar7 = create_record((int)lVar11,(int)lVar12,(int)lVar12,(rtr_socket *)0x0);
                  (psVar9->hashtable).bucket[lVar12] = (tommy_hashlin_node **)psVar7;
                  _spki_table_add_assert((spki_table *)&result,psVar7);
                }
                psVar9 = (spki_table *)(psVar9[4].hashtable.bucket + 0x10);
              }
              spki_table_get_all((spki_table *)&result,0,(uint8_t *)table.hashtable.bucket[0],
                                 (spki_record **)&result_len,(uint *)&stack0xffffffffffceebcc);
              __assert_fail("size == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                            ,0x1f8,"void test_ht_7(void)");
            }
            result_len = 0;
            spki_table_get_all((spki_table *)&result,(uint32_t)lVar11,local_1b0,
                               (spki_record **)psVar9,&result_len);
            pptVar2 = table.hashtable.bucket[0];
            if (result_len != 1) break;
            psVar7 = *(spki_record **)(ski + lVar11 * 8);
            _Var4 = spki_records_are_equal(psVar7,(spki_record *)table.hashtable.bucket[0]);
            if (!_Var4) {
              __assert_fail("spki_records_are_equal(records[i], &result[0])",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                            ,0x1de,"void test_ht_7(void)");
            }
            free(pptVar2);
            free(psVar7);
            lVar11 = lVar11 + 1;
          }
          __assert_fail("size == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x1dd,"void test_ht_7(void)");
        }
        result_len = 0;
        psVar7 = *(spki_record **)(ski + lVar11 * 8);
        spki_table_get_all((spki_table *)&result,0x9fb,psVar7->ski,(spki_record **)&table,
                           &result_len);
        pptVar2 = table.hashtable.bucket[0];
        if (result_len != 1) {
          __assert_fail("size == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x1c7,"void test_ht_7(void)");
        }
        _Var4 = spki_records_are_equal(psVar7,(spki_record *)table.hashtable.bucket[0]);
        if (!_Var4) break;
        free(pptVar2);
        free(psVar7);
        lVar11 = lVar11 + 1;
      }
      __assert_fail("spki_records_are_equal(records[i], &result[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x1c8,"void test_ht_7(void)");
    }
    for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
      pptVar2 = (psVar9->hashtable).bucket[lVar12];
      iVar6 = spki_table_search_by_ski((spki_table *)ski,(uint8_t *)pptVar2,&result,&result_len);
      if (iVar6 != 0) {
        __assertion = "spki_table_search_by_ski(table, ski, &result, &result_len) == SPKI_SUCCESS";
        uVar13 = 0x65;
LAB_001033e0:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,uVar13,"void _spki_table_search_assert(struct spki_table *, uint8_t *)");
      }
      if (result_len != 10) {
        __assertion = "result_len == NUM_SKIS_RECORDS";
        uVar13 = 0x66;
        goto LAB_001033e0;
      }
      free(result);
      free(pptVar2);
    }
    lVar11 = lVar11 + 1;
    psVar9 = (spki_table *)((psVar9->hashtable).bucket + 10);
  } while( true );
}

Assistant:

int main(void)
{
	test_ht_1();
	test_ht_2();
	test_ht_3();
	test_ht_4();
	test_ht_5();
	test_ht_6();
	test_ht_7();
	test_table_swap();
	test_table_diff();
	return EXIT_SUCCESS;
}